

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lprowsetbase.h
# Opt level: O3

void __thiscall
soplex::LPRowSetBase<double>::LPRowSetBase(LPRowSetBase<double> *this,int pmax,int pmemmax)

{
  SVSetBase<double>::SVSetBase(&this->super_SVSetBase<double>,pmax,pmemmax,1.1,1.2);
  (this->super_SVSetBase<double>).super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray =
       (_func_int **)&PTR__LPRowSetBase_0069e158;
  VectorBase<double>::VectorBase(&this->left,0);
  VectorBase<double>::VectorBase(&this->right,0);
  VectorBase<double>::VectorBase(&this->object,0);
  (this->scaleExp).data = (int *)0x0;
  (this->scaleExp).memFactor = 1.2;
  (this->scaleExp).thesize = 0;
  (this->scaleExp).themax = 1;
  spx_alloc<int*>(&(this->scaleExp).data,1);
  return;
}

Assistant:

explicit
   LPRowSetBase(int pmax = -1, int pmemmax = -1)
      : SVSetBase<R>(pmax, pmemmax), left(0), right(0), object(0), scaleExp(0)
   {
      assert(isConsistent());
   }